

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-bst.c
# Opt level: O1

pboolean p_tree_bst_remove(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                          PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,
                          pconstpointer key)

{
  PTreeBaseNode *pPVar1;
  pint pVar2;
  PTreeBaseNode_ *pPVar3;
  PTreeBaseNode_ *pPVar4;
  PTreeBaseNode *mem;
  
  pPVar1 = *root_node;
  do {
    mem = pPVar1;
    if (mem == (PTreeBaseNode *)0x0) {
      return 0;
    }
    pVar2 = (*compare_func)(key,mem->key,data);
    if (-1 < pVar2) {
      if (pVar2 == 0) {
        if ((mem->left != (PTreeBaseNode_ *)0x0) &&
           (pPVar4 = mem->left, pPVar1 = mem, mem->right != (PTreeBaseNode_ *)0x0)) {
          do {
            root_node = &pPVar1->left;
            pPVar3 = pPVar4;
            pPVar4 = pPVar3->right;
            pPVar1 = (PTreeBaseNode *)&pPVar3->right;
          } while (pPVar3->right != (PTreeBaseNode_ *)0x0);
          mem->key = pPVar3->key;
          mem->value = pPVar3->value;
          mem = pPVar3;
        }
        pPVar4 = mem->left;
        if (pPVar4 == (PTreeBaseNode_ *)0x0) {
          pPVar4 = mem->right;
        }
        ((PTreeBaseNode *)root_node)->left = pPVar4;
        if (key_destroy_func != (PDestroyFunc)0x0) {
          (*key_destroy_func)(mem->key);
        }
        if (value_destroy_func != (PDestroyFunc)0x0) {
          (*value_destroy_func)(mem->value);
        }
        p_free(mem);
        return 1;
      }
      mem = (PTreeBaseNode *)&mem->right;
    }
    pPVar1 = mem->left;
    root_node = &mem->left;
  } while( true );
}

Assistant:

pboolean
p_tree_bst_remove (PTreeBaseNode	**root_node,
		   PCompareDataFunc	compare_func,
		   ppointer		data,
		   PDestroyFunc		key_destroy_func,
		   PDestroyFunc		value_destroy_func,
		   pconstpointer	key)
{
	PTreeBaseNode	*cur_node;
	PTreeBaseNode	*prev_node;
	PTreeBaseNode	**node_pointer;
	pint		cmp_result;

	cur_node     = *root_node;
	node_pointer = root_node;

	while (cur_node != NULL) {
		cmp_result = compare_func (key, cur_node->key, data);

		if (cmp_result < 0) {
			node_pointer = &cur_node->left;
			cur_node     = cur_node->left;
		} else if (cmp_result > 0) {
			node_pointer = &cur_node->right;
			cur_node     = cur_node->right;
		} else
			break;
	}

	if (P_UNLIKELY (cur_node == NULL))
		return FALSE;

	if (cur_node->left != NULL && cur_node->right != NULL) {
		node_pointer = &cur_node->left;
		prev_node    = cur_node->left;

		while (prev_node->right != NULL) {
			node_pointer = &prev_node->right;
			prev_node    = prev_node->right;
		}

		cur_node->key   = prev_node->key;
		cur_node->value = prev_node->value;

		cur_node = prev_node;
	}

	*node_pointer = cur_node->left == NULL ? cur_node->right : cur_node->left;

	if (key_destroy_func != NULL)
		key_destroy_func (cur_node->key);

	if (value_destroy_func != NULL)
		value_destroy_func (cur_node->value);

	p_free (cur_node);

	return TRUE;
}